

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitCall(BinaryInstWriter *this,Call *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint32_t uVar1;
  undefined8 in_RAX;
  size_t in_RCX;
  void *__buf;
  undefined8 local_28;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_28._0_7_ = (undefined7)in_RAX;
  local_28 = CONCAT17(curr->isReturn * '\x02',(undefined7)local_28) | 0x1000000000000000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,(uchar *)((long)&local_28 + 7));
  uVar1 = WasmBinaryWriter::getFunctionIndex(this->parent,(Name)(curr->target).super_IString.str);
  local_28 = CONCAT44(local_28._4_4_,uVar1);
  LEB<unsigned_int,_unsigned_char>::write
            ((LEB<unsigned_int,_unsigned_char> *)&local_28,(int)this_00,__buf,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitCall(Call* curr) {
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallFunction : BinaryConsts::CallFunction;
  o << op << U32LEB(parent.getFunctionIndex(curr->target));
}